

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpMessage.cpp
# Opt level: O1

void __thiscall FIX::HttpMessage::HttpMessage(HttpMessage *this,string *string)

{
  _Rb_tree_header *p_Var1;
  
  (this->m_root)._M_dataplus._M_p = (pointer)&(this->m_root).field_2;
  (this->m_root)._M_string_length = 0;
  (this->m_root).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->m_parameters)._M_t._M_impl.super__Rb_tree_header;
  (this->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_parameters)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  setString(this,string);
  return;
}

Assistant:

EXCEPT(InvalidMessage) { setString(string); }